

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

void __thiscall rw::Image::compressPalette(Image *this)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8 *line;
  byte *pbVar6;
  
  if (this->depth == 8) {
    pbVar2 = this->pixels;
    iVar5 = 0;
    iVar3 = this->width;
    if (this->width < 1) {
      iVar3 = 0;
    }
    iVar4 = this->height;
    if (this->height < 1) {
      iVar4 = iVar5;
    }
    for (; pbVar6 = pbVar2, iVar1 = iVar3, iVar5 != iVar4; iVar5 = iVar5 + 1) {
      while (iVar1 != 0) {
        if (0xf < *pbVar6) {
          return;
        }
        pbVar6 = pbVar6 + this->bpp;
        iVar1 = iVar1 + -1;
      }
      pbVar2 = pbVar2 + this->stride;
    }
    this->depth = 4;
  }
  return;
}

Assistant:

void
Image::compressPalette(void)
{
	if(this->depth != 8)
		return;
	uint8 *pixels = this->pixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		for(int x = 0; x < this->width; x++){
			if(*line > 0xF) return;
			line += this->bpp;
		}
		pixels += this->stride;
	}
	this->depth = 4;
}